

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::OP_InitUndeclConsoleLetProperty(Var obj,PropertyId propertyId)

{
  JavascriptLibrary *pJVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  undefined8 in_RAX;
  RecyclableObject *pRVar5;
  undefined4 *puVar6;
  void *aValue;
  undefined4 uVar7;
  
  uVar7 = (undefined4)((ulong)in_RAX >> 0x20);
  pRVar5 = (RecyclableObject *)
           FrameDisplay::GetItem((FrameDisplay *)obj,*(ushort *)((long)obj + 2) - 1);
  bVar4 = VarIsImpl<Js::ConsoleScopeActivationObject>(pRVar5);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xbdb,
                                "(VarIs<ConsoleScopeActivationObject>((DynamicObject*)pScope->GetItem(pScope->GetLength() - 1)))"
                                ,"How come we got this opcode without ConsoleScopeActivationObject?"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  aValue = FrameDisplay::GetItem((FrameDisplay *)obj,0);
  pRVar5 = VarTo<Js::RecyclableObject>(aValue);
  pJVar1 = (((pRVar5->type).ptr)->javascriptLibrary).ptr;
  pTVar2 = ((pJVar1->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  bVar4 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
    [0x1e])(pRVar5,propertyId,(pJVar1->undeclBlockVarSentinel).ptr,0x47,0,0x90,CONCAT44(uVar7,0xf));
  pTVar2->noJsReentrancy = bVar4;
  return 1;
}

Assistant:

BOOL JavascriptOperators::OP_InitUndeclConsoleLetProperty(Var obj, PropertyId propertyId)
    {
        FrameDisplay *pScope = (FrameDisplay*)obj;
        AssertMsg(VarIs<ConsoleScopeActivationObject>((DynamicObject*)pScope->GetItem(pScope->GetLength() - 1)), "How come we got this opcode without ConsoleScopeActivationObject?");
        RecyclableObject* instance = VarTo<RecyclableObject>(pScope->GetItem(0));
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_InitUndeclConsoleLetFld, reentrancylock, instance->GetScriptContext()->GetThreadContext());

        PropertyOperationFlags flags = static_cast<PropertyOperationFlags>(PropertyOperation_SpecialValue | PropertyOperation_AllowUndecl);
        PropertyAttributes attributes = PropertyLetDefaults;
        instance->SetPropertyWithAttributes(propertyId, instance->GetLibrary()->GetUndeclBlockVar(), attributes, NULL, flags);
        return TRUE;
        JIT_HELPER_END(Op_InitUndeclConsoleLetFld);
    }